

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::toStringInternal(LatticeImpl *this,StringBuffer *os)

{
  ulong uVar1;
  char *pcVar2;
  size_t in_RCX;
  StringBuffer *in_RSI;
  StringBuffer *in_RDI;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  char *local_8;
  
  StringBuffer::clear(in_RSI);
  if (in_RDI[4].alloc_size_ == 0) {
    anon_unknown_3::writeLattice
              ((Lattice *)in_RDI,
               (StringBuffer *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  else {
    uVar1 = Writer::write((Writer *)in_RDI[4].alloc_size_,(int)in_RDI,in_RSI,in_RCX);
    if ((uVar1 & 1) == 0) {
      return (char *)0x0;
    }
  }
  StringBuffer::operator<<(in_RDI,in_stack_ffffffffffffffdf);
  pcVar2 = StringBuffer::str(in_RSI);
  if (pcVar2 == (char *)0x0) {
    (*in_RDI->_vptr_StringBuffer[0x25])(in_RDI,"output buffer overflow");
    local_8 = (char *)0x0;
  }
  else {
    local_8 = StringBuffer::str(in_RSI);
  }
  return local_8;
}

Assistant:

const char *LatticeImpl::toStringInternal(StringBuffer *os) {
  os->clear();
  if (writer_) {
    if (!writer_->write(this, os)) {
      return 0;
    }
  } else {
    writeLattice(this, os);
  }
  *os << '\0';
  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }
  return os->str();
}